

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O1

bool __thiscall QPDFTokenizer::Token::isWord(Token *this,string *value)

{
  size_t __n;
  int iVar1;
  
  if ((this->type == tt_word) &&
     (__n = (this->value)._M_string_length, __n == value->_M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((this->value)._M_dataplus._M_p,(value->_M_dataplus)._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool
        isWord(std::string const& value) const
        {
            return this->type == tt_word && this->value == value;
        }